

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O3

void nhdp_db_link_set_unsymmetric(nhdp_link *lnk)

{
  list_entity *plVar1;
  list_entity *plVar2;
  uint64_t uVar3;
  list_entity *plVar4;
  
  if (lnk->status == NHDP_LINK_SYMMETRIC) {
    _link_status_not_symmetric_anymore(lnk);
  }
  oonf_timer_stop(&lnk->sym_time);
  plVar4 = (lnk->_2hop).list_head.next;
  plVar2 = plVar4->prev;
  while (plVar2 != (lnk->_2hop).list_head.prev) {
    plVar1 = plVar4->next;
    nhdp_db_link_2hop_remove((nhdp_l2hop *)(plVar4 + -8));
    plVar4 = plVar1;
    plVar2 = plVar1->prev;
  }
  uVar3 = oonf_clock_getNow();
  lnk->last_status_change = uVar3;
  oonf_class_event(&_link_info,lnk,OONF_OBJECT_CHANGED);
  return;
}

Assistant:

void
nhdp_db_link_set_unsymmetric(struct nhdp_link *lnk) {
  struct nhdp_l2hop *twohop, *th_it;

  if (lnk->status == NHDP_LINK_SYMMETRIC) {
    _link_status_not_symmetric_anymore(lnk);
  }

  /* stop link timers */
  oonf_timer_stop(&lnk->sym_time);

  /* remove all 2hop addresses */
  avl_for_each_element_safe(&lnk->_2hop, twohop, _link_node, th_it) {
    nhdp_db_link_2hop_remove(twohop);
  }

  /* link status was changed */
  lnk->last_status_change = oonf_clock_getNow();

  /* trigger event */
  oonf_class_event(&_link_info, lnk, OONF_OBJECT_CHANGED);
}